

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

bool __thiscall
pbrt::FindMatchingNamedSpectrum::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,Spectrum *a,Spectrum *b)

{
  Float FVar1;
  Float lambda;
  Float *__end2;
  Float *__begin2;
  Float (*__range2) [14];
  Float wls [14];
  Float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  Float in_stack_ffffffffffffff74;
  undefined1 *local_68;
  undefined1 local_58 [56];
  undefined1 local_20 [32];
  
  memcpy(local_58,&DAT_00595d90,0x38);
  local_68 = local_58;
  while( true ) {
    if (local_68 == local_20) {
      return true;
    }
    in_stack_ffffffffffffff74 =
         Spectrum::operator()
                   ((Spectrum *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                    in_stack_ffffffffffffff6c);
    FVar1 = Spectrum::operator()
                      ((Spectrum *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
    if ((in_stack_ffffffffffffff74 != FVar1) || (NAN(in_stack_ffffffffffffff74) || NAN(FVar1)))
    break;
    local_68 = local_68 + 4;
  }
  return false;
}

Assistant:

std::string FindMatchingNamedSpectrum(Spectrum s) {
    auto sampledLambdasMatch = [](Spectrum a, Spectrum b) {
        const Float wls[] = {306, 360.932007, 380, 402, 455, 503, 579,
                             610, 660,        692, 702, 760, 800, 860};
        for (Float lambda : wls)
            if (a(lambda) != b(lambda))
                return false;
        return true;
    };
    for (const auto &spd : Spectra::namedSpectra) {
        if (sampledLambdasMatch(s, spd.second))
            return spd.first;
    }
    return "";
}